

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int_const,char_const*,char_const*,char_const*,char_const*>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
           *__return_storage_ptr__,v10 *this,int *args,char **args_1,char **args_2,char **args_3,
          char **args_4)

{
  longlong lVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool formattable_4;
  bool formattable_pointer_4;
  bool formattable_char_4;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_char_3;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  size_t local_160;
  size_t local_140;
  size_t local_120;
  size_t local_100;
  longlong local_68;
  size_t local_60;
  char **args_local_4;
  char **args_local_3;
  char **args_local_2;
  char **args_local_1;
  int *args_local;
  
  local_68._0_4_ = *(undefined4 *)this;
  lVar1 = *(longlong *)args;
  pcVar2 = *args_1;
  pcVar3 = *args_2;
  pcVar4 = *args_3;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_68;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_60;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = lVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_100;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = pcVar2;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_120;
  (__return_storage_ptr__->data_).args_[3].field_0.string.data = pcVar3;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_140;
  (__return_storage_ptr__->data_).args_[4].field_0.string.data = pcVar4;
  (__return_storage_ptr__->data_).args_[4].field_0.string.size = local_160;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}